

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_avx2.c
# Opt level: O0

uint32_t adler32_fold_copy_impl(uint32_t adler,uint8_t *dst,uint8_t *src,size_t len,int COPY)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  __m256i x;
  __m256i x_00;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint32_t uVar7;
  ulong in_RCX;
  undefined1 (*in_RDX) [32];
  uint8_t *in_RSI;
  uint in_EDI;
  int in_R8D;
  __m256i vsum2;
  __m256i v_short_sum2;
  __m256i vs1_sad;
  __m256i vbuf;
  size_t k;
  __m256i vs3;
  __m256i vs1_0;
  __m256i zero;
  __m256i dot3v;
  __m256i dot2v;
  __m256i vs2;
  __m256i vs1;
  uint32_t adler1;
  uint32_t adler0;
  ulong local_5e0;
  undefined8 in_stack_fffffffffffffa58;
  undefined8 in_stack_fffffffffffffa60;
  undefined8 in_stack_fffffffffffffa68;
  longlong in_stack_fffffffffffffa70;
  undefined8 in_stack_fffffffffffffa98;
  undefined8 in_stack_fffffffffffffaa0;
  undefined8 in_stack_fffffffffffffaa8;
  longlong in_stack_fffffffffffffab0;
  ulong local_528;
  undefined1 local_520 [32];
  ulong local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  size_t in_stack_fffffffffffffb58;
  uint8_t *in_stack_fffffffffffffb60;
  uint8_t *in_stack_fffffffffffffb68;
  undefined8 in_stack_fffffffffffffb70;
  size_t in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb80 [32];
  undefined1 auVar8 [32];
  undefined1 local_460 [32];
  uint32_t local_434;
  uint32_t local_430;
  ulong local_428;
  undefined1 (*local_420) [32];
  uint8_t *local_418;
  uint local_408;
  ulong uStack_3d8;
  ulong uStack_3b8;
  ulong local_360;
  uint8_t *local_100;
  uint8_t *puStack_f8;
  undefined8 uStack_f0;
  size_t sStack_e8;
  undefined8 uStack_b0;
  size_t sStack_a8;
  
  if (in_RDX == (undefined1 (*) [32])0x0) {
    local_408 = 1;
  }
  else {
    local_408 = in_EDI;
    if (in_RCX != 0) {
      local_434 = in_EDI >> 0x10;
      local_430 = in_EDI & 0xffff;
      local_428 = in_RCX;
      local_420 = in_RDX;
      local_418 = in_RSI;
      do {
        if (local_428 < 0x10) {
          if (in_R8D != 0) {
            uVar7 = adler32_copy_len_16(local_430,(uint8_t *)local_420,local_418,local_428,local_434
                                       );
            return uVar7;
          }
          uVar7 = adler32_len_16(local_430,(uint8_t *)local_420,local_428,local_434);
          return uVar7;
        }
        if (local_428 < 0x20) {
          if (in_R8D != 0) {
            uVar7 = adler32_fold_copy_sse42
                              ((uint32_t)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                               in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
            return uVar7;
          }
          uVar7 = adler32_ssse3(in_stack_fffffffffffffb80._12_4_,in_stack_fffffffffffffb80._0_8_,
                                in_stack_fffffffffffffb78);
          return uVar7;
        }
        auVar1 = vpinsrb_avx(ZEXT116(0x20),0x1f,1);
        auVar1 = vpinsrb_avx(auVar1,0x1e,2);
        auVar1 = vpinsrb_avx(auVar1,0x1d,3);
        auVar1 = vpinsrb_avx(auVar1,0x1c,4);
        auVar1 = vpinsrb_avx(auVar1,0x1b,5);
        auVar1 = vpinsrb_avx(auVar1,0x1a,6);
        auVar1 = vpinsrb_avx(auVar1,0x19,7);
        auVar1 = vpinsrb_avx(auVar1,0x18,8);
        auVar1 = vpinsrb_avx(auVar1,0x17,9);
        auVar1 = vpinsrb_avx(auVar1,0x16,10);
        auVar1 = vpinsrb_avx(auVar1,0x15,0xb);
        auVar1 = vpinsrb_avx(auVar1,0x14,0xc);
        auVar1 = vpinsrb_avx(auVar1,0x13,0xd);
        auVar1 = vpinsrb_avx(auVar1,0x12,0xe);
        auVar1 = vpinsrb_avx(auVar1,0x11,0xf);
        auVar2 = vpinsrb_avx(ZEXT116(0x10),0xf,1);
        auVar2 = vpinsrb_avx(auVar2,0xe,2);
        auVar2 = vpinsrb_avx(auVar2,0xd,3);
        auVar2 = vpinsrb_avx(auVar2,0xc,4);
        auVar2 = vpinsrb_avx(auVar2,0xb,5);
        auVar2 = vpinsrb_avx(auVar2,10,6);
        auVar2 = vpinsrb_avx(auVar2,9,7);
        auVar2 = vpinsrb_avx(auVar2,8,8);
        auVar2 = vpinsrb_avx(auVar2,7,9);
        auVar2 = vpinsrb_avx(auVar2,6,10);
        auVar2 = vpinsrb_avx(auVar2,5,0xb);
        auVar2 = vpinsrb_avx(auVar2,4,0xc);
        auVar2 = vpinsrb_avx(auVar2,3,0xd);
        auVar2 = vpinsrb_avx(auVar2,2,0xe);
        auVar2 = vpinsrb_avx(auVar2,1,0xf);
        local_100 = auVar1._0_8_;
        puStack_f8 = auVar1._8_8_;
        uStack_f0 = auVar2._0_8_;
        sStack_e8 = auVar2._8_8_;
        auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
        auVar1 = vpinsrw_avx(auVar1,1,2);
        auVar1 = vpinsrw_avx(auVar1,1,3);
        auVar1 = vpinsrw_avx(auVar1,1,4);
        auVar1 = vpinsrw_avx(auVar1,1,5);
        auVar1 = vpinsrw_avx(auVar1,1,6);
        auVar1 = vpinsrw_avx(auVar1,1,7);
        auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
        auVar2 = vpinsrw_avx(auVar2,1,2);
        auVar2 = vpinsrw_avx(auVar2,1,3);
        auVar2 = vpinsrw_avx(auVar2,1,4);
        auVar2 = vpinsrw_avx(auVar2,1,5);
        auVar2 = vpinsrw_avx(auVar2,1,6);
        auVar2 = vpinsrw_avx(auVar2,1,7);
        uStack_b0 = auVar2._0_8_;
        sStack_a8 = auVar2._8_8_;
        uStack_3b8 = SUB328(ZEXT832(0),4);
        while (0x1f < local_428) {
          local_360 = (ulong)local_430;
          local_460 = ZEXT832(local_360);
          auVar8 = ZEXT432(local_434);
          local_500 = local_360;
          uStack_4f8 = 0;
          uStack_4f0 = 0;
          uStack_4e8 = 0;
          uStack_3d8 = SUB328(ZEXT832(0),4);
          local_520 = ZEXT832(uStack_3d8) << 0x40;
          if (local_428 < 0x15b1) {
            local_5e0 = local_428;
          }
          else {
            local_5e0 = 0x15b0;
          }
          local_528 = local_5e0 - (local_5e0 & 0x1f);
          local_428 = local_428 - local_528;
          while (0x1f < local_528) {
            in_stack_fffffffffffffaa0 = *(undefined8 *)*local_420;
            in_stack_fffffffffffffaa8 = *(undefined8 *)(*local_420 + 8);
            in_stack_fffffffffffffab0 = *(longlong *)(*local_420 + 0x10);
            uVar4 = *(undefined8 *)(*local_420 + 0x18);
            auVar6 = *local_420;
            auVar3 = *local_420;
            local_420 = local_420 + 1;
            local_528 = local_528 - 0x20;
            auVar3 = vpsadbw_avx2(auVar3,ZEXT832(uStack_3b8) << 0x40);
            in_stack_fffffffffffffa98 = auVar3._24_8_;
            if (in_R8D != 0) {
              *(undefined8 *)local_418 = in_stack_fffffffffffffaa0;
              *(undefined8 *)(local_418 + 8) = in_stack_fffffffffffffaa8;
              *(longlong *)(local_418 + 0x10) = in_stack_fffffffffffffab0;
              *(undefined8 *)(local_418 + 0x18) = uVar4;
              local_418 = local_418 + 0x20;
            }
            local_460 = vpaddd_avx2(local_460,auVar3);
            auVar3._8_8_ = uStack_4f8;
            auVar3._0_8_ = local_500;
            auVar3._16_8_ = uStack_4f0;
            auVar3._24_8_ = uStack_4e8;
            local_520 = vpaddd_avx2(local_520,auVar3);
            auVar5._8_8_ = puStack_f8;
            auVar5._0_8_ = local_100;
            auVar5._16_8_ = uStack_f0;
            auVar5._24_8_ = sStack_e8;
            auVar3 = vpmaddubsw_avx2(auVar6,auVar5);
            in_stack_fffffffffffffa60 = auVar3._0_8_;
            in_stack_fffffffffffffa68 = auVar3._8_8_;
            in_stack_fffffffffffffa70 = auVar3._16_8_;
            auVar6._16_8_ = uStack_b0;
            auVar6._0_16_ = auVar1;
            auVar6._24_8_ = sStack_a8;
            auVar3 = vpmaddwd_avx2(auVar3,auVar6);
            in_stack_fffffffffffffa58 = auVar3._24_8_;
            auVar8 = vpaddd_avx2(auVar3,auVar8);
            local_500 = local_460._0_8_;
            uStack_4f8 = local_460._8_8_;
            uStack_4f0 = local_460._16_8_;
            uStack_4e8 = local_460._24_8_;
          }
          auVar3 = vpslld_avx2(local_520,ZEXT416(5));
          in_stack_fffffffffffffb80 = vpaddd_avx2(auVar8,auVar3);
          x_00[1] = in_stack_fffffffffffffaa0;
          x_00[0] = in_stack_fffffffffffffa98;
          x_00[2] = in_stack_fffffffffffffaa8;
          x_00[3] = in_stack_fffffffffffffab0;
          uVar7 = partial_hsum256(x_00);
          local_430 = uVar7 % 0xfff1;
          x[1] = in_stack_fffffffffffffa60;
          x[0] = in_stack_fffffffffffffa58;
          x[2] = in_stack_fffffffffffffa68;
          x[3] = in_stack_fffffffffffffa70;
          uVar7 = hsum256(x);
          local_434 = uVar7 % 0xfff1;
        }
        local_408 = local_430 | local_434 << 0x10;
        in_stack_fffffffffffffb58 = sStack_a8;
        in_stack_fffffffffffffb60 = local_100;
        in_stack_fffffffffffffb68 = puStack_f8;
        in_stack_fffffffffffffb70 = uStack_f0;
        in_stack_fffffffffffffb78 = sStack_e8;
      } while (local_428 != 0);
    }
  }
  return local_408;
}

Assistant:

static inline uint32_t adler32_fold_copy_impl(uint32_t adler, uint8_t *dst, const uint8_t *src, size_t len, const int COPY) {
    if (src == NULL) return 1L;
    if (len == 0) return adler;

    uint32_t adler0, adler1;
    adler1 = (adler >> 16) & 0xffff;
    adler0 = adler & 0xffff;

rem_peel:
    if (len < 16) {
        if (COPY) {
            return adler32_copy_len_16(adler0, src, dst, len, adler1);
        } else {
            return adler32_len_16(adler0, src, len, adler1);
        }
    } else if (len < 32) {
        if (COPY) {
            return adler32_fold_copy_sse42(adler, dst, src, len);
        } else {
            return adler32_ssse3(adler, src, len);
        }
    }

    __m256i vs1, vs2;

    const __m256i dot2v = _mm256_setr_epi8(32, 31, 30, 29, 28, 27, 26, 25, 24, 23, 22, 21, 20, 19, 18, 17, 16, 15,
                                           14, 13, 12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1);
    const __m256i dot3v = _mm256_set1_epi16(1);
    const __m256i zero = _mm256_setzero_si256();

    while (len >= 32) {
        vs1 = _mm256_zextsi128_si256(_mm_cvtsi32_si128(adler0));
        vs2 = _mm256_zextsi128_si256(_mm_cvtsi32_si128(adler1));
        __m256i vs1_0 = vs1;
        __m256i vs3 = _mm256_setzero_si256();

        size_t k = MIN(len, NMAX);
        k -= k % 32;
        len -= k;

        while (k >= 32) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 32 vs1 + sum( (32-i+1) c[i] )
            */
            __m256i vbuf = _mm256_loadu_si256((__m256i*)src);
            src += 32;
            k -= 32;

            __m256i vs1_sad = _mm256_sad_epu8(vbuf, zero); // Sum of abs diff, resulting in 2 x int32's

            if (COPY) {
                _mm256_storeu_si256((__m256i*)dst, vbuf);
                dst += 32;
            }
 
            vs1 = _mm256_add_epi32(vs1, vs1_sad);
            vs3 = _mm256_add_epi32(vs3, vs1_0);
            __m256i v_short_sum2 = _mm256_maddubs_epi16(vbuf, dot2v); // sum 32 uint8s to 16 shorts
            __m256i vsum2 = _mm256_madd_epi16(v_short_sum2, dot3v); // sum 16 shorts to 8 uint32s
            vs2 = _mm256_add_epi32(vsum2, vs2);
            vs1_0 = vs1;
        }

        /* Defer the multiplication with 32 to outside of the loop */
        vs3 = _mm256_slli_epi32(vs3, 5);
        vs2 = _mm256_add_epi32(vs2, vs3);

        /* The compiler is generating the following sequence for this integer modulus
         * when done the scalar way, in GPRs:

         adler = (s1_unpack[0] % BASE) + (s1_unpack[1] % BASE) + (s1_unpack[2] % BASE) + (s1_unpack[3] % BASE) +
                 (s1_unpack[4] % BASE) + (s1_unpack[5] % BASE) + (s1_unpack[6] % BASE) + (s1_unpack[7] % BASE);

         mov    $0x80078071,%edi // move magic constant into 32 bit register %edi
         ...
         vmovd  %xmm1,%esi // move vector lane 0 to 32 bit register %esi
         mov    %rsi,%rax  // zero-extend this value to 64 bit precision in %rax
         imul   %rdi,%rsi // do a signed multiplication with magic constant and vector element
         shr    $0x2f,%rsi // shift right by 47
         imul   $0xfff1,%esi,%esi // do a signed multiplication with value truncated to 32 bits with 0xfff1
         sub    %esi,%eax // subtract lower 32 bits of original vector value from modified one above
         ...
         // repeats for each element with vpextract instructions

         This is tricky with AVX2 for a number of reasons:
             1.) There's no 64 bit multiplication instruction, but there is a sequence to get there
             2.) There's ways to extend vectors to 64 bit precision, but no simple way to truncate
                 back down to 32 bit precision later (there is in AVX512)
             3.) Full width integer multiplications aren't cheap

         We can, however, do a relatively cheap sequence for horizontal sums.
         Then, we simply do the integer modulus on the resulting 64 bit GPR, on a scalar value. It was
         previously thought that casting to 64 bit precision was needed prior to the horizontal sum, but
         that is simply not the case, as NMAX is defined as the maximum number of scalar sums that can be
         performed on the maximum possible inputs before overflow
         */


         /* In AVX2-land, this trip through GPRs will probably be unavoidable, as there's no cheap and easy
          * conversion from 64 bit integer to 32 bit (needed for the inexpensive modulus with a constant).
          * This casting to 32 bit is cheap through GPRs (just register aliasing). See above for exactly
          * what the compiler is doing to avoid integer divisions. */
         adler0 = partial_hsum256(vs1) % BASE;
         adler1 = hsum256(vs2) % BASE;
    }

    adler = adler0 | (adler1 << 16);

    if (len) {
        goto rem_peel;
    }

    return adler;
}